

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Expr * substExpr(SubstContext *pSubst,Expr *pExpr)

{
  byte *pbVar1;
  u8 uVar2;
  sqlite3 *db;
  bool bVar3;
  SrcList *pSVar4;
  Expr *pEVar5;
  u8 uVar6;
  Select *pSVar7;
  Expr *p;
  SrcList **ppSVar8;
  long lVar9;
  Expr ifNullRow;
  Expr local_78;
  
  if (pExpr == (Expr *)0x0) {
    return (Expr *)0x0;
  }
  if (((pExpr->flags & 1) != 0) && (pSubst->iTable == (int)pExpr->iRightJoinTable)) {
    pExpr->iRightJoinTable = (i16)pSubst->iNewTable;
  }
  if (pExpr->op == 0xab) {
    if (pExpr->iTable == pSubst->iTable) {
      pExpr->iTable = pSubst->iNewTable;
    }
LAB_001a743f:
    pEVar5 = substExpr(pSubst,pExpr->pLeft);
    pExpr->pLeft = pEVar5;
    pEVar5 = substExpr(pSubst,pExpr->pRight);
    pExpr->pRight = pEVar5;
    pSVar7 = (Select *)(pExpr->x).pList;
    if ((pExpr->flags & 0x800) == 0) {
      if ((pSVar7 != (Select *)0x0) && (0 < *(int *)&pSVar7->pEList)) {
        ppSVar8 = (SrcList **)&pSVar7->op;
        lVar9 = 0;
        do {
          pSVar4 = (SrcList *)substExpr(pSubst,(Expr *)*ppSVar8);
          *ppSVar8 = pSVar4;
          lVar9 = lVar9 + 1;
          ppSVar8 = ppSVar8 + 4;
        } while (lVar9 < *(int *)&pSVar7->pEList);
      }
    }
    else {
      substSelect(pSubst,pSVar7,1);
    }
    return pExpr;
  }
  if ((pExpr->op != 0xa2) || (pExpr->iTable != pSubst->iTable)) goto LAB_001a743f;
  if ((long)pExpr->iColumn < 0) {
    pExpr->op = 'r';
    return pExpr;
  }
  pEVar5 = pSubst->pEList->a[pExpr->iColumn].pExpr;
  uVar2 = pEVar5->op;
  uVar6 = uVar2;
  if (uVar2 == 0xa8) {
    uVar6 = pEVar5->op2;
  }
  if (uVar6 == 0x83) {
    pSVar7 = (pEVar5->x).pSelect;
  }
  else {
    bVar3 = true;
    if (uVar6 != 0xa9) goto LAB_001a74cf;
    pSVar7 = (Select *)&pEVar5->x;
  }
  bVar3 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar7->pEList)->pList->nExpr < 2;
LAB_001a74cf:
  if (bVar3) {
    db = pSubst->pParse->db;
    p = pEVar5;
    if ((uVar2 != 0xa2) && (pSubst->isLeftJoin != 0)) {
      local_78.u.zToken = (char *)0x0;
      local_78.pRight = (Expr *)0x0;
      local_78.iColumn = 0;
      local_78.iAgg = 0;
      local_78.iRightJoinTable = 0;
      local_78.op2 = '\0';
      local_78._55_1_ = 0;
      local_78.pAggInfo = (AggInfo *)0x0;
      local_78.x.pList = (ExprList *)0x0;
      local_78.y.pTab = (Table *)0x0;
      local_78.op = 0xab;
      local_78.affinity = '\0';
      local_78._2_2_ = 0;
      local_78.flags = 0;
      local_78._40_8_ = (ulong)(uint)pSubst->iNewTable << 0x20;
      p = &local_78;
      local_78.pLeft = pEVar5;
    }
    pEVar5 = exprDup(db,p,0,(u8 **)0x0);
    if (pEVar5 != (Expr *)0x0) {
      if (pSubst->isLeftJoin != 0) {
        pbVar1 = (byte *)((long)&pEVar5->flags + 2);
        *pbVar1 = *pbVar1 | 0x10;
      }
      if ((pExpr->flags & 1) != 0) {
        pEVar5->iRightJoinTable = pExpr->iRightJoinTable;
        *(byte *)&pEVar5->flags = (byte)pEVar5->flags | 1;
      }
    }
    sqlite3ExprDeleteNN(db,pExpr);
    return pEVar5;
  }
  sqlite3VectorErrorMsg(pSubst->pParse,pEVar5);
  return pExpr;
}

Assistant:

static Expr *substExpr(
  SubstContext *pSubst,  /* Description of the substitution */
  Expr *pExpr            /* Expr in which substitution occurs */
){
  if( pExpr==0 ) return 0;
  if( ExprHasProperty(pExpr, EP_FromJoin)
   && pExpr->iRightJoinTable==pSubst->iTable
  ){
    pExpr->iRightJoinTable = pSubst->iNewTable;
  }
  if( pExpr->op==TK_COLUMN && pExpr->iTable==pSubst->iTable ){
    if( pExpr->iColumn<0 ){
      pExpr->op = TK_NULL;
    }else{
      Expr *pNew;
      Expr *pCopy = pSubst->pEList->a[pExpr->iColumn].pExpr;
      Expr ifNullRow;
      assert( pSubst->pEList!=0 && pExpr->iColumn<pSubst->pEList->nExpr );
      assert( pExpr->pRight==0 );
      if( sqlite3ExprIsVector(pCopy) ){
        sqlite3VectorErrorMsg(pSubst->pParse, pCopy);
      }else{
        sqlite3 *db = pSubst->pParse->db;
        if( pSubst->isLeftJoin && pCopy->op!=TK_COLUMN ){
          memset(&ifNullRow, 0, sizeof(ifNullRow));
          ifNullRow.op = TK_IF_NULL_ROW;
          ifNullRow.pLeft = pCopy;
          ifNullRow.iTable = pSubst->iNewTable;
          pCopy = &ifNullRow;
        }
        testcase( ExprHasProperty(pCopy, EP_Subquery) );
        pNew = sqlite3ExprDup(db, pCopy, 0);
        if( pNew && pSubst->isLeftJoin ){
          ExprSetProperty(pNew, EP_CanBeNull);
        }
        if( pNew && ExprHasProperty(pExpr,EP_FromJoin) ){
          pNew->iRightJoinTable = pExpr->iRightJoinTable;
          ExprSetProperty(pNew, EP_FromJoin);
        }
        sqlite3ExprDelete(db, pExpr);
        pExpr = pNew;
      }
    }
  }else{
    if( pExpr->op==TK_IF_NULL_ROW && pExpr->iTable==pSubst->iTable ){
      pExpr->iTable = pSubst->iNewTable;
    }
    pExpr->pLeft = substExpr(pSubst, pExpr->pLeft);
    pExpr->pRight = substExpr(pSubst, pExpr->pRight);
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      substSelect(pSubst, pExpr->x.pSelect, 1);
    }else{
      substExprList(pSubst, pExpr->x.pList);
    }
  }
  return pExpr;
}